

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

Instr * __thiscall
IRBuilder::BuildProfiledFieldLoad
          (IRBuilder *this,OpCode loadOp,RegOpnd *dstOpnd,SymOpnd *srcOpnd,CacheId inlineCacheIndex,
          bool *pUnprofiled)

{
  code *pcVar1;
  bool bVar2;
  JitProfilingInstr *pJVar3;
  JITTimeFunctionBody *pJVar4;
  ProfiledInstr *this_00;
  JITTimeProfileInfo *this_01;
  TSize *pTVar5;
  undefined4 *puVar6;
  char16 *pcVar7;
  FunctionJITTimeInfo *this_02;
  char16 *pcVar8;
  char local_198 [8];
  char valueTypeStr [256];
  char16 debugStringBuffer [42];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  bVar2 = Func::DoSimpleJitDynamicProfile(this->m_func);
  if (bVar2) {
    pJVar3 = IR::JitProfilingInstr::New
                       (loadOp,&dstOpnd->super_Opnd,&srcOpnd->super_Opnd,this->m_func);
    return &pJVar3->super_Instr;
  }
  pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::HasProfileInfo(pJVar4);
  if (bVar2) {
    this_00 = IR::ProfiledInstr::New(loadOp,&dstOpnd->super_Opnd,&srcOpnd->super_Opnd,this->m_func);
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    this_01 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar4);
    pTVar5 = (TSize *)JITTimeProfileInfo::GetFldInfo(this_01,inlineCacheIndex);
    if ((this_00->super_Instr).m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar2) goto LAB_004d83e6;
      *puVar6 = 0;
    }
    (this_00->u).field_3.fldInfoData = *pTVar5;
    if ((this_00->super_Instr).m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar2) goto LAB_004d83e6;
      *puVar6 = 0;
    }
    bVar2 = ValueType::IsUninitialized((ValueType *)&(this_00->u).field_3);
    *pUnprofiled = bVar2;
    if ((this_00->super_Instr).m_kind != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
      if (!bVar2) goto LAB_004d83e6;
      *puVar6 = 0;
    }
    IR::Opnd::SetValueType(&dstOpnd->super_Opnd,(ValueType)(this_00->u).field_3.fldInfoData.f1);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,DynamicProfilePhase);
    if (bVar2) {
      if ((this_00->super_Instr).m_kind != InstrKindProfiled) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
        if (!bVar2) {
LAB_004d83e6:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      local_32[0] = (anon_union_2_4_ea848c7b_for_ValueType_13)(this_00->u).field_3.fldInfoData.f1;
      ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_198);
      pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      pcVar7 = JITTimeFunctionBody::GetDisplayName(pJVar4);
      this_02 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
      pcVar8 = FunctionJITTimeInfo::GetDebugNumberSet(this_02,(wchar (*) [42])(valueTypeStr + 0xf8))
      ;
      Output::Print(L"TestTrace function %s (%s) ValueType = %i ",pcVar7,pcVar8,
                    (char (*) [256])local_198);
      IR::Instr::DumpTestTrace(&this_00->super_Instr);
    }
  }
  else {
    this_00 = (ProfiledInstr *)0x0;
  }
  return &this_00->super_Instr;
}

Assistant:

IR::Instr *
IRBuilder::BuildProfiledFieldLoad(Js::OpCode loadOp, IR::RegOpnd *dstOpnd, IR::SymOpnd *srcOpnd, Js::CacheId inlineCacheIndex, bool *pUnprofiled)
{
    IR::Instr * instr = nullptr;

    // Prefer JitProfilingInstr if we're in simplejit
    if (m_func->DoSimpleJitDynamicProfile())
    {
        instr = IR::JitProfilingInstr::New(loadOp, dstOpnd, srcOpnd, m_func);
    }
    else if (this->m_func->HasProfileInfo())
    {
        instr = IR::ProfiledInstr::New(loadOp, dstOpnd, srcOpnd, m_func);
        instr->AsProfiledInstr()->u.FldInfo() = *(m_func->GetReadOnlyProfileInfo()->GetFldInfo(inlineCacheIndex));
        *pUnprofiled = !instr->AsProfiledInstr()->u.FldInfo().WasLdFldProfiled();
        dstOpnd->SetValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if(Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::DynamicProfilePhase))
        {
            const ValueType valueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            char valueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            valueType.ToString(valueTypeStr);
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Output::Print(_u("TestTrace function %s (%s) ValueType = %i "), m_func->GetJITFunctionBody()->GetDisplayName(), m_func->GetDebugNumberSet(debugStringBuffer), valueTypeStr);
            instr->DumpTestTrace();
        }
#endif
    }

    return instr;
}